

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiGpj.cxx
# Opt level: O0

void GhsMultiGpj::WriteGpjTag(Types gpjType,ostream *fout)

{
  char *pcVar1;
  ostream *this;
  char *tag;
  ostream *fout_local;
  Types gpjType_local;
  
  pcVar1 = GetGpjTag(gpjType);
  this = std::operator<<(fout,pcVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void GhsMultiGpj::WriteGpjTag(Types gpjType, std::ostream& fout)
{
  char const* tag;
  tag = GhsMultiGpj::GetGpjTag(gpjType);
  fout << tag << std::endl;
}